

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::verifyRecursive
          (BinaryAtomicIntermValuesInstance *this,deInt32 index,deInt32 valueSoFar,bool *argsUsed,
          deInt32 *atomicArgs,deInt32 *resultValues)

{
  bool bVar1;
  deInt32 valueSoFar_00;
  int local_3c;
  deInt32 i;
  deInt32 *resultValues_local;
  deInt32 *atomicArgs_local;
  bool *argsUsed_local;
  deInt32 valueSoFar_local;
  deInt32 index_local;
  BinaryAtomicIntermValuesInstance *this_local;
  
  if (index < 5) {
    for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
      if (((argsUsed[local_3c] & 1U) == 0) && (resultValues[local_3c] == valueSoFar)) {
        argsUsed[local_3c] = true;
        valueSoFar_00 =
             computeBinaryAtomicOperationResult
                       ((this->super_BinaryAtomicInstanceBase).m_operation,valueSoFar,
                        atomicArgs[local_3c]);
        bVar1 = verifyRecursive(this,index + 1,valueSoFar_00,argsUsed,atomicArgs,resultValues);
        if (bVar1) {
          return true;
        }
        argsUsed[local_3c] = false;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryAtomicIntermValuesInstance::verifyRecursive (const deInt32	index,
														const deInt32	valueSoFar,
														bool			argsUsed[NUM_INVOCATIONS_PER_PIXEL],
														const deInt32	atomicArgs[NUM_INVOCATIONS_PER_PIXEL],
														const deInt32	resultValues[NUM_INVOCATIONS_PER_PIXEL]) const
{
	if (index >= static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL))
		return true;

	for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
	{
		if (!argsUsed[i] && resultValues[i] == valueSoFar)
		{
			argsUsed[i] = true;

			if (verifyRecursive(index + 1, computeBinaryAtomicOperationResult(m_operation, valueSoFar, atomicArgs[i]), argsUsed, atomicArgs, resultValues))
			{
				return true;
			}

			argsUsed[i] = false;
		}
	}

	return false;
}